

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

fy_token * fy_token_alloc(void)

{
  fy_token *pfVar1;
  long lVar2;
  
  pfVar1 = (fy_token *)calloc(1,0x130);
  if (pfVar1 != (fy_token *)0x0) {
    for (lVar2 = 0; lVar2 != 0xa8; lVar2 = lVar2 + 0x38) {
      *(undefined8 *)((long)&pfVar1->comment[0].fyi + lVar2) = 0;
    }
    pfVar1->refs = 1;
  }
  return pfVar1;
}

Assistant:

struct fy_token *fy_token_alloc(void) {
    struct fy_token *fyt;
    unsigned int i;

    fyt = malloc(sizeof(*fyt));
    if (!fyt)
        return fyt;

    memset(fyt, 0, sizeof(*fyt));

    fyt->type = FYTT_NONE;
    fyt->analyze_flags = 0;
    fyt->text_len = 0;
    fyt->text = NULL;
    fyt->text0 = NULL;
    fyt->handle.fyi = NULL;
    for (i = 0; i < sizeof(fyt->comment) / sizeof(fyt->comment[0]); i++)
        fyt->comment[i].fyi = NULL;

    fyt->refs = 1;

    return fyt;
}